

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void * luaL_checkudata(lua_State *L,int ud,char *tname)

{
  int iVar1;
  void *pvVar2;
  TValue *pTVar3;
  GCObject *pGVar4;
  
  iVar1 = 1;
  pvVar2 = lua_touserdata(L,1);
  if (pvVar2 != (void *)0x0) {
    iVar1 = lua_getmetatable(L,iVar1);
    if (iVar1 != 0) {
      lua_getfield(L,-10000,"FILE*");
      iVar1 = lua_rawequal(L,-1,-2);
      if (iVar1 != 0) {
        L->top = L->top + -2;
        return pvVar2;
      }
    }
  }
  iVar1 = 1;
  luaL_typerror(L,1,"FILE*");
  pTVar3 = index2adr(L,iVar1);
  if (pTVar3->tt == 2) {
    pGVar4 = (pTVar3->value).gc;
  }
  else if (pTVar3->tt == 7) {
    pGVar4 = (GCObject *)&(((pTVar3->value).gc)->h).lastfree;
  }
  else {
    pGVar4 = (GCObject *)0x0;
  }
  return pGVar4;
}

Assistant:

static void*luaL_checkudata(lua_State*L,int ud,const char*tname){
void*p=lua_touserdata(L,ud);
if(p!=NULL){
if(lua_getmetatable(L,ud)){
lua_getfield(L,(-10000),tname);
if(lua_rawequal(L,-1,-2)){
lua_pop(L,2);
return p;
}
}
}
luaL_typerror(L,ud,tname);
return NULL;
}